

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * oaffect_loc_name(int location)

{
  undefined4 in_EDI;
  int *in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "none";
    break;
  case 1:
    local_8 = "value0";
    break;
  case 2:
    local_8 = "value1";
    break;
  case 3:
    local_8 = "value2";
    break;
  case 4:
    local_8 = "value3";
    break;
  case 5:
    local_8 = "value4";
    break;
  case 6:
    local_8 = "weight";
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    CLogger::Warn<int&>((CLogger *)CONCAT44(location,in_stack_00000018),
                        (string_view)in_stack_00000020,in_stack_00000010);
    local_8 = "(unknown)";
  }
  return local_8;
}

Assistant:

char *oaffect_loc_name(int location)
{
	switch (location)
	{
		case APPLY_OBJ_NONE:
			return "none";
		case APPLY_OBJ_V0:
			return "value0";
		case APPLY_OBJ_V1:
			return "value1";
		case APPLY_OBJ_V2:
			return "value2";
		case APPLY_OBJ_V3:
			return "value3";
		case APPLY_OBJ_V4:
			return "value4";
		case APPLY_OBJ_WEIGHT:
			return "weight";
	}

	RS.Logger.Warn("oaffect_loc_name: unknown  location {}.", location);
	return "(unknown)";
}